

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O3

void debugReportMarkSingC
               (HighsInt call_id,HighsInt highs_debug_level,HighsLogOptions *log_options,
               HighsInt num_row,vector<int,_std::allocator<int>_> *iwork,HighsInt *basic_index)

{
  char *format;
  uint uVar1;
  ulong uVar2;
  char *format_00;
  
  if (0x7b < num_row || highs_debug_level == 0) {
    return;
  }
  if (call_id == 1) {
    highsLogDev(log_options,kWarning,"\nMarkSingC2");
    highsLogDev(log_options,kWarning,"\nIndex  ");
    if (0 < num_row) {
      uVar2 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",uVar2);
        uVar1 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar1;
      } while (num_row != uVar1);
      highsLogDev(log_options,kWarning,"\nNwBaseI");
      format_00 = "\n";
      if (0 < num_row) {
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",(ulong)(uint)basic_index[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)num_row != uVar2);
      }
      goto LAB_00373873;
    }
    format_00 = "\n";
    format = "\nNwBaseI";
  }
  else {
    if (call_id != 0) {
      return;
    }
    highsLogDev(log_options,kWarning,"\nMarkSingC1");
    highsLogDev(log_options,kWarning,"\nIndex  ");
    if (0 < num_row) {
      uVar2 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",uVar2);
        uVar1 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar1;
      } while (num_row != uVar1);
      highsLogDev(log_options,kWarning,"\niwork  ");
      if (0 < num_row) {
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)num_row != uVar2);
        highsLogDev(log_options,kWarning,"\nBaseI  ");
        if (num_row < 1) {
          return;
        }
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",(ulong)(uint)basic_index[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)num_row != uVar2);
        return;
      }
      format_00 = "\nBaseI  ";
      goto LAB_00373873;
    }
    format_00 = "\nBaseI  ";
    format = "\niwork  ";
  }
  highsLogDev(log_options,kWarning,format);
LAB_00373873:
  highsLogDev(log_options,kWarning,format_00);
  return;
}

Assistant:

void debugReportMarkSingC(const HighsInt call_id,
                          const HighsInt highs_debug_level,
                          const HighsLogOptions& log_options,
                          const HighsInt num_row, const vector<HighsInt>& iwork,
                          const HighsInt* basic_index) {
  if (highs_debug_level == kHighsDebugLevelNone) return;
  if (num_row > 123) return;
  if (call_id == 0) {
    highsLogDev(log_options, HighsLogType::kWarning, "\nMarkSingC1");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\niwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nBaseI  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
  } else if (call_id == 1) {
    highsLogDev(log_options, HighsLogType::kWarning, "\nMarkSingC2");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nNwBaseI");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  }
}